

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O3

void __thiscall LLVMBC::StreamState::append(StreamState *this,SwitchInst *branch,bool param_2)

{
  const_iterator this_00;
  const_iterator cVar1;
  ConstantInt *value;
  BasicBlock *this_01;
  Value *local_40;
  BasicBlock *local_38;
  
  local_40 = SwitchInst::getCondition(branch);
  local_38 = SwitchInst::getDefaultDest(branch);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"switch ",7);
  append<LLVMBC::Value*,char_const(&)[3],LLVMBC::BasicBlock*>
            (this,&local_40,(char (*) [3])", ",&local_38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," {",2);
  this->indent = this->indent + 1;
  this_00 = SwitchInst::case_begin(branch);
  cVar1 = SwitchInst::case_end(branch);
  if (this_00._M_current != cVar1._M_current) {
    do {
      newline(this);
      value = SwitchInst::Case::getCaseValue(this_00._M_current);
      this_01 = SwitchInst::Case::getCaseSuccessor(this_00._M_current);
      append(this,value,false);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", ",2);
      local_40 = (Value *)Value::get_tween_id(&this_01->super_Value);
      append<char_const(&)[8],unsigned_long>
                (this,(char (*) [8])"label %",(unsigned_long *)&local_40);
      this_00._M_current = this_00._M_current + 1;
      cVar1 = SwitchInst::case_end(branch);
    } while (this_00._M_current != cVar1._M_current);
  }
  end_scope(this);
  return;
}

Assistant:

void StreamState::append(SwitchInst *branch, bool)
{
	append("switch ", branch->getCondition(), ", ", branch->getDefaultDest());
	begin_scope();
	for (auto itr = branch->case_begin(); itr != branch->case_end(); ++itr)
	{
		newline();
		append(itr->getCaseValue(), ", ", itr->getCaseSuccessor());
	}
	end_scope();
}